

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void lockBtreeMutex(Btree *p)

{
  BtShared *pBVar1;
  
  pBVar1 = p->pBt;
  if (pBVar1->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(pBVar1->mutex);
    pBVar1 = p->pBt;
  }
  pBVar1->db = p->db;
  p->locked = '\x01';
  return;
}

Assistant:

static void lockBtreeMutex(Btree *p){
  assert( p->locked==0 );
  assert( sqlite3_mutex_notheld(p->pBt->mutex) );
  assert( sqlite3_mutex_held(p->db->mutex) );

  sqlite3_mutex_enter(p->pBt->mutex);
  p->pBt->db = p->db;
  p->locked = 1;
}